

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

void __thiscall
vkt::shaderexecutor::PrecisionCase::
testStatement<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>,vkt::shaderexecutor::OutTypes<tcu::Matrix<float,3,3>,vkt::shaderexecutor::Void>>
          (PrecisionCase *this,
          Variables<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_3>,_vkt::shaderexecutor::Void>_>
          *variables,Statement *stmt)

{
  string *this_00;
  ShaderSpec *this_01;
  vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_> *this_02;
  ostream *poVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  Environment env;
  ostringstream os;
  
  env.m_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &env.m_map._M_t._M_impl.super__Rb_tree_header._M_header;
  env.m_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  env.m_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  env.m_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       env.m_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  poVar1 = std::operator<<((ostream *)&os,"precision ");
  pcVar2 = glu::getPrecisionName((this->m_ctx).precision);
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1," float;\n");
  std::__cxx11::stringbuf::str();
  this_00 = &(this->m_spec).globalDeclarations;
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  if ((this->m_extension)._M_string_length != 0) {
    std::operator+(&local_1f0,"#extension ",&this->m_extension);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&os,
                   &local_1f0," : require\n");
    std::__cxx11::string::operator=((string *)this_00,(string *)&os);
    std::__cxx11::string::~string((string *)&os);
    std::__cxx11::string::~string((string *)&local_1f0);
  }
  this_01 = &this->m_spec;
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::resize
            (&this_01->inputs,2);
  makeSymbol<tcu::Vector<float,3>>
            ((Symbol *)&os,this,
             (variables->in1).
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>.m_ptr);
  Symbol::operator=((this_01->inputs).
                    super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1,(Symbol *)&os);
  Symbol::~Symbol((Symbol *)&os);
  makeSymbol<tcu::Vector<float,3>>
            ((Symbol *)&os,this,
             (variables->in0).
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>.m_ptr);
  Symbol::operator=((this_01->inputs).
                    super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                    ._M_impl.super__Vector_impl_data._M_start,(Symbol *)&os);
  Symbol::~Symbol((Symbol *)&os);
  this_02 = &(this->m_spec).outputs;
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::resize
            (this_02,1);
  makeSymbol<tcu::Matrix<float,3,3>>
            ((Symbol *)&os,this,
             (variables->out0).
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_3>_>_>.m_ptr)
  ;
  Symbol::operator=((this_02->
                    super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                    )._M_impl.super__Vector_impl_data._M_start,(Symbol *)&os);
  Symbol::~Symbol((Symbol *)&os);
  de::toString<vkt::shaderexecutor::Statement>((string *)&os,stmt);
  std::__cxx11::string::operator=((string *)&(this->m_spec).source,(string *)&os);
  std::__cxx11::string::~string((string *)&os);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
               *)&env);
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>& variables, const Statement& stmt)
{
	const int		inCount		= numInputs<In>();
	const int		outCount	= numOutputs<Out>();
	Environment		env;		// Hoisted out of the inner loop for optimization.

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		m_spec.globalDeclarations = os.str();
	}

	if (!m_extension.empty())
		m_spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	m_spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: m_spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	m_spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	m_spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	m_spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	m_spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	m_spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	m_spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	m_spec.source = de::toString(stmt);
}